

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O1

void __thiscall
IRC_Bot::IRC_Bot(IRC_Bot *this,Config *in_primary_section,Config *in_secondary_section)

{
  pointer ppIVar1;
  int iVar2;
  undefined4 extraout_var;
  IRCCommand **command;
  pointer ppIVar3;
  undefined1 auVar4 [16];
  IRCCommand *local_38;
  
  Jupiter::IRC::Client::Client(&this->super_Client,in_primary_section,in_secondary_section);
  *(undefined ***)this = &PTR_think_00113ad8;
  (this->m_commands).
  super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_commands).
  super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_commands).
  super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_commandPrefix)._M_dataplus._M_p = (pointer)&(this->m_commandPrefix).field_2;
  (this->m_commandPrefix)._M_string_length = 0;
  (this->m_commandPrefix).field_2._M_local_buf[0] = '\0';
  auVar4 = Jupiter::IRC::Client::readConfigValue(this,6,"Prefix",0,0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_commandPrefix,0,(this->m_commandPrefix)._M_string_length,auVar4._8_8_,
             auVar4._0_8_);
  ppIVar1 = g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    ppIVar3 = g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar2 = (*((*ppIVar3)->super_Command)._vptr_Command[5])();
      local_38 = (IRCCommand *)CONCAT44(extraout_var,iVar2);
      std::
      vector<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>,std::allocator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>>>
      ::emplace_back<IRCCommand*>
                ((vector<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>,std::allocator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>>>
                  *)&this->m_commands,&local_38);
      ppIVar3 = ppIVar3 + 1;
    } while (ppIVar3 != ppIVar1);
  }
  setCommandAccessLevels(this,(IRCCommand *)0x0);
  return;
}

Assistant:

IRC_Bot::IRC_Bot(Jupiter::Config *in_primary_section, Jupiter::Config *in_secondary_section)
	: Client(in_primary_section, in_secondary_section) {
	m_commandPrefix = this->readConfigValue("Prefix"sv);
	
	for (const auto& command : IRCMasterCommandList) {
		m_commands.emplace_back(command->copy());
	}

	setCommandAccessLevels();
}